

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O0

void __thiscall
xLearn::PARSER_TEST_Parse_libsvm_no_y_comma_Test::TestBody
          (PARSER_TEST_Parse_libsvm_no_y_comma_Test *this)

{
  char *in_stack_00000020;
  LibsvmParser parser;
  DMatrix matrix;
  uint64 size;
  char *buffer;
  char *in_stack_000000f8;
  LibsvmParser *in_stack_00000100;
  char **in_stack_00000128;
  string *in_stack_00000130;
  bool in_stack_0000019e;
  bool in_stack_0000019f;
  DMatrix *in_stack_000001a0;
  bool in_stack_000001ae;
  bool in_stack_000001af;
  DMatrix *in_stack_000001b0;
  string *splitor;
  undefined1 *this_00;
  allocator<char> local_e1;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  DMatrix *in_stack_ffffffffffffff50;
  
  this_00 = Kfilename_abi_cxx11_;
  write_data((string *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ReadFileToMemory(in_stack_00000130,in_stack_00000128);
  DMatrix::DMatrix(in_stack_ffffffffffffff50);
  LibsvmParser::LibsvmParser((LibsvmParser *)this_00);
  Parser::setLabel((Parser *)&stack0xffffffffffffff50,false);
  splitor = (string *)&local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,",",(allocator *)splitor);
  Parser::setSplitor((Parser *)this_00,splitor);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  LibsvmParser::Parse(in_stack_00000100,in_stack_000000f8,(uint64)this,(DMatrix *)buffer,size._7_1_)
  ;
  check(in_stack_000001a0,in_stack_0000019f,in_stack_0000019e);
  LibsvmParser::Parse(in_stack_00000100,in_stack_000000f8,(uint64)this,(DMatrix *)buffer,size._7_1_)
  ;
  check_double(in_stack_000001b0,in_stack_000001af,in_stack_000001ae);
  LibsvmParser::Parse(in_stack_00000100,in_stack_000000f8,(uint64)this,(DMatrix *)buffer,size._7_1_)
  ;
  check(in_stack_000001a0,in_stack_0000019f,in_stack_0000019e);
  std::__cxx11::string::c_str();
  RemoveFile(in_stack_00000020);
  LibsvmParser::~LibsvmParser((LibsvmParser *)0x149b6d);
  DMatrix::~DMatrix((DMatrix *)this_00);
  return;
}

Assistant:

TEST(PARSER_TEST, Parse_libsvm_no_y_comma) {
  write_data(Kfilename, kStrNoy_comma);
  char* buffer = nullptr;
  uint64 size = ReadFileToMemory(Kfilename, &buffer);
  DMatrix matrix;
  LibsvmParser parser;
  parser.setLabel(false);
  parser.setSplitor(",");
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, false);
  parser.Parse(buffer, size, matrix, false);
  check_double(matrix, false, false);
  parser.Parse(buffer, size, matrix, true);
  check(matrix, false, false);
  RemoveFile(Kfilename.c_str());
}